

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::SetColumnOffset(int column_index,float offset)

{
  float fVar1;
  int iVar2;
  ImGuiColumns *pIVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  ImGuiColumnData *pIVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  
  while( true ) {
    pIVar5 = GImGui;
    pIVar3 = (GImGui->CurrentWindow->DC).CurrentColumns;
    if (pIVar3 == (ImGuiColumns *)0x0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1d89,"SetColumnOffset","ImGui ASSERT FAILED: %s","columns != NULL");
    }
    if (column_index < 0) {
      column_index = pIVar3->Current;
    }
    if ((pIVar3->Columns).Size <= column_index) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1d8d,"SetColumnOffset","ImGui ASSERT FAILED: %s",
                  "column_index < columns->Columns.Size");
    }
    if ((pIVar3->Flags & 4) == 0) {
      bVar4 = column_index < pIVar3->Count + -1;
    }
    else {
      bVar4 = false;
    }
    fVar11 = 0.0;
    if (bVar4) {
      iVar8 = column_index;
      if (column_index < 0) {
        iVar8 = pIVar3->Current;
      }
      iVar6 = iVar8 + 1;
      iVar2 = (pIVar3->Columns).Size;
      if (pIVar3->IsBeingResized == false) {
        if (iVar2 <= iVar6) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        fVar11 = (pIVar3->Columns).Data[iVar6].OffsetNorm;
        if ((pIVar3->Columns).Size <= iVar8) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar7 = (pIVar3->Columns).Data + iVar8;
      }
      else {
        if (iVar2 <= iVar6) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        fVar11 = (pIVar3->Columns).Data[iVar6].OffsetNormBeforeResize;
        if ((pIVar3->Columns).Size <= iVar8) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar7 = (ImGuiColumnData *)&(pIVar3->Columns).Data[iVar8].OffsetNormBeforeResize;
      }
      fVar11 = (pIVar3->OffMaxX - pIVar3->OffMinX) * (fVar11 - pIVar7->OffsetNorm);
    }
    if (((pIVar3->Flags & 8) == 0) &&
       (fVar10 = pIVar3->OffMaxX -
                 (float)(pIVar3->Count - column_index) * (pIVar5->Style).ColumnsMinSpacing,
       fVar10 <= offset)) {
      offset = fVar10;
    }
    fVar10 = pIVar3->OffMinX;
    fVar1 = pIVar3->OffMaxX;
    if ((pIVar3->Columns).Size <= column_index) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    (pIVar3->Columns).Data[column_index].OffsetNorm = (offset - fVar10) / (fVar1 - fVar10);
    if (!bVar4) break;
    column_index = column_index + 1;
    fVar10 = (pIVar5->Style).ColumnsMinSpacing;
    uVar9 = -(uint)(fVar11 <= fVar10);
    offset = offset + (float)(~uVar9 & (uint)fVar11 | (uint)fVar10 & uVar9);
  }
  return;
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiColumnsFlags_NoPreserveWidths) && (column_index < columns->Count - 1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiColumnsFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->OffMaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = GetColumnNormFromOffset(columns, offset - columns->OffMinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}